

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint128_c_t farmhash128_cc_city_with_seed(char *s,size_t len,uint128_c_t seed)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  char *s_00;
  uint64_t uVar13;
  uint128_c_t uVar14;
  uint128_c_t uVar15;
  uint128_c_t uVar16;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  
  uVar5 = seed.b;
  local_50 = seed.a;
  if (len < 0x80) {
    if (len < 0x11) {
      lVar6 = -0x651e95c4d06fbfb1;
      uVar9 = (local_50 * -0x4b6d499041670d8d >> 0x2f ^ local_50 * -0x4b6d499041670d8d) *
              -0x4b6d499041670d8d;
      if (len < 8) {
        if (len < 4) {
          if (len != 0) {
            uVar10 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                     (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
            lVar6 = (uVar10 >> 0x2f ^ uVar10) * -0x651e95c4d06fbfb1;
          }
        }
        else {
          lVar6 = len * 2 + -0x651e95c4d06fbfb1;
          uVar10 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar6;
          uVar10 = (uVar10 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar10) * lVar6;
          lVar6 = (uVar10 >> 0x2f ^ uVar10) * lVar6;
        }
        uVar13 = lVar6 + uVar5 * -0x4b6d499041670d8d;
        uVar3 = uVar13;
      }
      else {
        uVar10 = *(ulong *)(s + (len - 8));
        uVar13 = *(uint64_t *)s;
        lVar6 = len * 2 + -0x651e95c4d06fbfb1;
        uVar7 = uVar13 + 0x9ae16a3b2f90404f;
        uVar8 = ((uVar7 >> 0x19 | uVar7 << 0x27) + uVar10) * lVar6;
        uVar10 = ((uVar10 >> 0x25 | uVar10 << 0x1b) * lVar6 + uVar7 ^ uVar8) * lVar6;
        uVar10 = (uVar10 >> 0x2f ^ uVar8 ^ uVar10) * lVar6;
        uVar3 = (uVar10 >> 0x2f ^ uVar10) * lVar6 + uVar5 * -0x4b6d499041670d8d;
      }
      uVar13 = uVar13 + uVar9 >> 0x2f ^ uVar13 + uVar9;
    }
    else {
      uVar3 = farmhash_len_16(*(long *)(s + (len - 8)) + 0xb492b66fbe98f273,local_50);
      uVar13 = farmhash_len_16(uVar5 + len,uVar3 + *(long *)(s + (len - 0x10)));
      uVar9 = uVar13 + local_50;
      uVar10 = len + 0x10;
      do {
        lVar6 = *(long *)s;
        uVar10 = uVar10 - 0x10;
        plVar4 = (long *)((long)s + 8);
        s = (char *)((long)s + 0x10);
        uVar9 = (((ulong)(lVar6 * -0x4b6d499041670d8d) >> 0x2f ^ lVar6 * -0x4b6d499041670d8d) *
                 -0x4b6d499041670d8d ^ uVar9) * -0x4b6d499041670d8d;
        uVar5 = uVar5 ^ uVar9;
        uVar3 = (((ulong)(*plVar4 * -0x4b6d499041670d8d) >> 0x2f ^ *plVar4 * -0x4b6d499041670d8d) *
                 -0x4b6d499041670d8d ^ uVar3) * -0x4b6d499041670d8d;
        uVar13 = uVar13 ^ uVar3;
      } while (0x20 < uVar10);
    }
    uVar1 = farmhash_len_16(uVar9,uVar3);
    uVar2 = farmhash_len_16(uVar13,uVar5);
    uVar5 = uVar2 ^ uVar1;
  }
  else {
    uVar9 = len * -0x4b6d499041670d8d;
    s_00 = s + 0x40;
    uVar10 = ((uVar5 ^ 0xb492b66fbe98f273) >> 0x31 | (uVar5 ^ 0xb492b66fbe98f273) << 0xf) *
             -0x4b6d499041670d8d + *(long *)s;
    uVar14.b = (uVar10 >> 0x2a | uVar10 * 0x400000) * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar14.a = uVar10;
    uVar15.b = (*(long *)(s + 0x58) + local_50 >> 0x35 | (*(long *)(s + 0x58) + local_50) * 0x800) *
               -0x4b6d499041670d8d;
    uVar15.a = (uVar9 + uVar5 >> 0x23 | (uVar9 + uVar5) * 0x20000000) * -0x4b6d499041670d8d +
               local_50;
    sVar11 = len;
    do {
      uVar10 = uVar5 + uVar14.b + *(long *)(s_00 + -0x10);
      uVar9 = uVar9 + uVar15.a;
      uVar5 = local_50 + uVar5 + uVar14.a + *(long *)(s_00 + -0x38);
      lVar6 = (uVar9 >> 0x21 | uVar9 * 0x80000000) * -0x4b6d499041670d8d;
      lVar12 = uVar14.a + *(long *)(s_00 + -0x18) +
               (uVar10 >> 0x2a | uVar10 * 0x400000) * -0x4b6d499041670d8d;
      uVar9 = (uVar5 >> 0x25 | uVar5 * 0x8000000) * -0x4b6d499041670d8d ^ uVar15.b;
      uVar14 = weak_farmhash_cc_len_32_with_seeds
                         (s_00 + -0x40,uVar14.b * -0x4b6d499041670d8d,uVar15.a + uVar9);
      uVar15 = weak_farmhash_cc_len_32_with_seeds
                         (s_00 + -0x20,uVar15.b + lVar6,*(long *)(s_00 + -0x30) + lVar12);
      uVar9 = uVar9 + uVar15.a;
      uVar5 = lVar6 + lVar12 + uVar14.a + *(long *)(s_00 + 8);
      local_50 = (uVar9 >> 0x21 | uVar9 * 0x80000000) * -0x4b6d499041670d8d;
      uVar10 = lVar12 + uVar14.b + *(long *)(s_00 + 0x30);
      uVar9 = (uVar5 >> 0x25 | uVar5 * 0x8000000) * -0x4b6d499041670d8d ^ uVar15.b;
      uVar5 = uVar14.a + *(long *)(s_00 + 0x28) +
              (uVar10 >> 0x2a | uVar10 * 0x400000) * -0x4b6d499041670d8d;
      uVar14 = weak_farmhash_cc_len_32_with_seeds
                         (s_00,uVar14.b * -0x4b6d499041670d8d,uVar15.a + uVar9);
      uVar15 = weak_farmhash_cc_len_32_with_seeds
                         (s_00 + 0x20,uVar15.b + local_50,*(long *)(s_00 + 0x10) + uVar5);
      local_48 = uVar15.b;
      uVar10 = uVar15.a;
      s_00 = s_00 + 0x80;
      sVar11 = sVar11 - 0x80;
    } while (0x7f < sVar11);
    uVar7 = uVar14.a + uVar9;
    local_58 = uVar10 * 9;
    lVar12 = (uVar10 >> 0x1b | uVar10 << 0x25) + uVar9 * -0x3c5a37a36834ced9;
    local_50 = (uVar7 >> 0x31 | uVar7 * 0x8000) * -0x3c5a37a36834ced9 + local_50;
    lVar6 = (local_48 >> 0x25 | local_48 << 0x1b) + uVar5 * -0x3c5a37a36834ced9;
    plVar4 = (long *)(s + (len - 0x20));
    uVar5 = 0;
    while( true ) {
      uVar13 = uVar14.b;
      uVar3 = uVar14.a * -0x3c5a37a36834ced9;
      if (sVar11 <= uVar5) break;
      uVar5 = uVar5 + 0x20;
      local_58 = local_58 + plVar4[2];
      uVar9 = lVar6 + local_50;
      local_50 = local_50 * -0x3c5a37a36834ced9 + local_58;
      lVar6 = (uVar9 >> 0x2a | uVar9 * 0x400000) * -0x3c5a37a36834ced9 + uVar13;
      lVar12 = lVar12 + local_48 + *plVar4;
      local_48 = local_48 + uVar3;
      uVar14 = weak_farmhash_cc_len_32_with_seeds((char *)plVar4,uVar3 + lVar12,uVar13);
      plVar4 = plVar4 + -4;
    }
    uVar2 = farmhash_len_16(local_50,uVar3);
    uVar1 = farmhash_len_16(lVar6 + lVar12,local_58);
    uVar3 = farmhash_len_16(uVar2 + uVar13,local_48);
    uVar5 = uVar3 + uVar1;
    uVar2 = uVar2 + local_48;
    uVar1 = uVar1 + uVar13;
  }
  uVar3 = farmhash_len_16(uVar2,uVar1);
  uVar16.b = uVar3;
  uVar16.a = uVar5;
  return uVar16;
}

Assistant:

uint128_c_t farmhash128_cc_city_with_seed(const char *s, size_t len, uint128_c_t seed) {
  if (len < 128) {
    return farmhash_cc_city_murmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  uint128_c_t v, w;
  uint64_t x = uint128_c_t_low64(seed);
  uint64_t y = uint128_c_t_high64(seed);
  uint64_t z = len * k1;
  size_t tail_done;

  v.a = ror64(y ^ k1, 49) * k1 + fetch64(s);
  v.b = ror64(v.a, 42) * k1 + fetch64(s + 8);
  w.a = ror64(y + z, 35) * k1 + x;
  w.b = ror64(x + fetch64(s + 88), 53) * k1;

  // This is the same inner loop as cityhash64(), manually unrolled.
  do {
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_cc_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_cc_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_cc_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_cc_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
    len -= 128;
  } while (likely(len >= 128));
  x += ror64(v.a + z, 49) * k0;
  y = y * k0 + ror64(w.b, 37);
  z = z * k0 + ror64(w.a, 27);
  w.a *= 9;
  v.a *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = ror64(x + y, 42) * k0 + v.b;
    w.a += fetch64(s + len - tail_done + 16);
    x = x * k0 + w.a;
    z += w.b + fetch64(s + len - tail_done);
    w.b += v.a;
    v = weak_farmhash_cc_len_32_with_seeds(s + len - tail_done, v.a + z, v.b);
    v.a *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = farmhash_len_16(x, v.a);
  y = farmhash_len_16(y + z, w.a);
  return make_uint128_c_t(farmhash_len_16(x + v.b, w.b) + y,
                   farmhash_len_16(x + w.b, y + v.b));
}